

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void become_aware(chunk *c,monster_conflict *mon)

{
  uint32_t *puVar1;
  byte *pbVar2;
  object *obj_00;
  player_upkeep *ppVar3;
  _Bool _Var4;
  monster_lore *pmVar5;
  object *dest;
  object *poVar6;
  loc lVar7;
  object *obj;
  char o_name [80];
  
  pmVar5 = get_lore(mon->race);
  _Var4 = flag_has_dbg(mon->mflag,2,7,"mon->mflag","MFLAG_CAMOUFLAGE");
  if (_Var4) {
    flag_off(mon->mflag,2,7);
    _Var4 = flag_has_dbg(mon->race->flags,0xc,0x16,"mon->race->flags","RF_UNAWARE");
    if (_Var4) {
      flag_on_dbg(pmVar5->flags,0xc,0x16,"lore->flags","RF_UNAWARE");
    }
    obj_00 = mon->mimicked_obj;
    if (obj_00 != (object *)0x0) {
      object_desc(o_name,0x50,obj_00,0,player);
      _Var4 = square_isseen((chunk_conflict *)c,obj_00->grid);
      if (_Var4) {
        msg("The %s was really a monster!",o_name);
      }
      obj_00->mimicking_m_idx = 0;
      mon->mimicked_obj = (object *)0x0;
      _Var4 = flag_has_dbg(mon->race->flags,0xc,0x1e,"mon->race->flags","RF_MIMIC_INV");
      if (_Var4) {
        dest = object_new();
        object_copy(dest,obj_00);
        dest->oidx = 0;
        if (obj_00->known != (object *)0x0) {
          poVar6 = object_new();
          dest->known = poVar6;
          object_copy(poVar6,obj_00->known);
          poVar6 = dest->known;
          poVar6->oidx = 0;
          lVar7 = (loc)loc(0,0);
          poVar6->grid = lVar7;
        }
        monster_carry(c,mon,dest);
      }
      square_delete_object((chunk_conflict *)c,obj_00->grid,obj_00,false,false);
      update_mon(mon,c,false);
    }
    ppVar3 = player->upkeep;
    if (mon->race->light != L'\0') {
      puVar1 = &ppVar3->update;
      *(byte *)puVar1 = (byte)*puVar1 | 0xc0;
    }
    pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
    *pbVar2 = *pbVar2 | 0xc0;
  }
  square_note_spot(c,mon->grid);
  square_light_spot(c,mon->grid);
  return;
}

Assistant:

void become_aware(struct chunk *c, struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);

	if (mflag_has(mon->mflag, MFLAG_CAMOUFLAGE)) {
		mflag_off(mon->mflag, MFLAG_CAMOUFLAGE);

		/* Learn about mimicry */
		if (rf_has(mon->race->flags, RF_UNAWARE))
			rf_on(lore->flags, RF_UNAWARE);

		/* Delete any false items */
		if (mon->mimicked_obj) {
			struct object *obj = mon->mimicked_obj;
			char o_name[80];
			object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

			/* Print a message */
			if (square_isseen(c, obj->grid))
				msg("The %s was really a monster!", o_name);

			/* Clear the mimicry */
			obj->mimicking_m_idx = 0;
			mon->mimicked_obj = NULL;

			/*
			 * Give a copy of the object to the monster if
			 * appropriate.
			 */
			if (rf_has(mon->race->flags, RF_MIMIC_INV)) {
				struct object* given = object_new();

				object_copy(given, obj);
				given->oidx = 0;
				if (obj->known) {
					given->known = object_new();
					object_copy(given->known, obj->known);
					given->known->oidx = 0;
					given->known->grid = loc(0, 0);
				}
				if (!monster_carry(c, mon, given)) {
					struct chunk *p_c = (c == cave) ? player->cave : NULL;
					if (given->known) {
						object_delete(p_c, NULL, &given->known);
					}
					object_delete(c, p_c, &given);
				}
			}

			/*
			 * Delete the mimicked object; noting and lighting
			 * done below outside of the if block.
			 */
			square_delete_object(c, obj->grid, obj, false, false);

			/* Since mimicry affects visibility, update that. */
			update_mon(mon, c, false);
		}

		/* Update monster and item lists */
		if (mon->race->light != 0) {
			player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
		}
		player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);
	}

	square_note_spot(c, mon->grid);
	square_light_spot(c, mon->grid);
}